

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,char *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  size_t sVar1;
  byte *pbVar2;
  char cVar3;
  char *f1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *this_00;
  bool bVar4;
  bool bVar5;
  undefined8 in_RAX;
  long *plVar6;
  undefined7 extraout_var;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  size_t sVar7;
  char *pcVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  pVar9;
  int result;
  ostringstream msg;
  undefined1 auStack_208 [12];
  int local_1fc;
  long *local_1f8 [2];
  long local_1e8 [2];
  char *local_1d8;
  ulong local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_1b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_1d0 = 0;
  this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
  local_1c8 = internalDependsFileName;
  local_1b8 = &validDeps->_M_t;
  while( true ) {
    while( true ) {
      do {
        sVar1 = this->MaxPath;
        pcVar8 = this->Dependee;
        std::ios::widen((char)*(undefined8 *)(*(long *)internalDepends + -0x18) +
                        (char)internalDepends);
        plVar6 = (long *)std::istream::getline((char *)internalDepends,(long)pcVar8,(char)sVar1);
        if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
          return (bool)((byte)local_1c0 & 1);
        }
        pbVar2 = (byte *)this->Dependee;
      } while (((ulong)*pbVar2 < 0x24) && ((0x800002001U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0));
      sVar7 = *(size_t *)(internalDepends + 8);
      if (pbVar2[sVar7 - 2] == 0xd) {
        pbVar2[sVar7 - 2] = 0;
        sVar7 = sVar7 - 1;
      }
      pcVar8 = this->Dependee;
      if (*pcVar8 == ' ') break;
      memcpy(this->Depender,pcVar8,sVar7);
      bVar4 = cmsys::SystemTools::FileExists(this->Depender);
      local_1d0 = CONCAT71(extraout_var,bVar4);
      std::__cxx11::string::string((string *)local_1a8,this->Depender,(allocator *)local_1f8);
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)local_1b8,(key_type *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    pcVar8 = pcVar8 + 1;
    local_1d8 = this->Depender;
    if (this_01 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      sVar7 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    f1 = local_1c8;
    bVar4 = cmsys::SystemTools::FileExists(pcVar8);
    if (!bVar4) break;
    local_1b0 = this_01;
    if ((local_1d0 & 1) == 0) {
      local_1fc = 0;
      bVar5 = cmFileTimeComparison::FileTimeCompare(this->FileComparison,f1,pcVar8,&local_1fc);
      bVar4 = -1 < local_1fc && bVar5;
      if ((-1 >= local_1fc || !bVar5) && (this->Verbose == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependee \"",10);
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\" is newer than depends file \"",0x1e);
        pcVar8 = local_1c8;
        if (local_1c8 == (char *)0x0) {
          std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x60);
        }
        else {
          sVar7 = strlen(local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
        cVar3 = (char)(ostream *)local_1a8;
        std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)local_1f8[0]);
        goto LAB_0041e7ca;
      }
    }
    else {
      local_1fc = 0;
      bVar5 = cmFileTimeComparison::FileTimeCompare
                        (this->FileComparison,local_1d8,pcVar8,&local_1fc);
      bVar4 = -1 < local_1fc && bVar5;
      if ((-1 >= local_1fc || !bVar5) && (this->Verbose == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependee \"",10);
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"\" is newer than depender \"",0x1a);
        pcVar8 = local_1d8;
        if (local_1d8 == (char *)0x0) {
          std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x60);
        }
        else {
          sVar7 = strlen(local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
        cVar3 = (char)(ostream *)local_1a8;
        std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((char *)local_1f8[0]);
LAB_0041e7ca:
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
    }
    this_01 = local_1b0;
    if (!bVar4) {
LAB_0041e9ab:
      if (this_01 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
        std::__cxx11::string::string((string *)local_1a8,this->Depender,(allocator *)local_1f8);
        this_00 = local_1b8;
        pVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                ::equal_range(local_1b8,(key_type *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
      local_1c0 = 0;
      if ((local_1d0 & 1) != 0) {
        std::__cxx11::string::string((string *)local_1a8,local_1d8,(allocator *)local_1f8);
        cmsys::SystemTools::RemoveFile((string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
        local_1d0 = 0;
        local_1c0 = 0;
      }
    }
  }
  if (this->Verbose == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependee \"",10);
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\" does not exist for depender \"",0x1f);
    pcVar8 = local_1d8;
    if (local_1d8 == (char *)0x0) {
      std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x60);
    }
    else {
      sVar7 = strlen(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    cVar3 = (char)(ostringstream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_1f8[0]);
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  goto LAB_0041e9ab;
}

Assistant:

bool cmDepends::CheckDependencies(std::istream& internalDepends,
                                  const char* internalDependsFileName,
                            std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = 0;

  while(internalDepends.getline(this->Dependee, this->MaxPath))
    {
    if ( this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
         this->Dependee[0] == '\r' )
      {
      continue;
      }
    size_t len = internalDepends.gcount()-1;
    if ( this->Dependee[len-1] == '\r' )
      {
      len --;
      this->Dependee[len] = 0;
      }
    if ( this->Dependee[0] != ' ' )
      {
      memcpy(this->Depender, this->Dependee, len+1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
      }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const char* dependee = this->Dependee+1;
    const char* depender = this->Depender;
    if (currentDependencies != 0)
      {
      currentDependencies->push_back(dependee);
      }

    if(!cmSystemTools::FileExists(dependee))
      {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if(this->Verbose)
        {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee
            << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
        }
      }
    else
      {
      if(dependerExists)
        {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if((!this->FileComparison->FileTimeCompare(depender, dependee,
                                              &result) || result < 0))
          {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if(this->Verbose)
            {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
            }
          }
        }
      else
        {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if((!this->FileComparison->FileTimeCompare(internalDependsFileName,
                                             dependee, &result) || result < 0))
          {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if(this->Verbose)
            {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
            }
          }
        }
      }
    if(regenerate)
      {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != 0)
        {
        validDeps.erase(this->Depender);
        currentDependencies = 0;
        }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists)
        {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
        }
      }
    }

  return okay;
}